

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_CutAreaRef_rec(Jf_Man_t *p,int *pCut)

{
  uint uVar1;
  int *piVar2;
  word *pwVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar6 = (uint)*pCut >> 4 & 0xf;
  if ((*pCut & 0xfU) != 0) {
    uVar8 = 0;
    do {
      uVar7 = pCut[uVar8 + 1];
      if ((int)uVar7 < 0) {
LAB_006ca613:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      if (uVar7 < 2) {
        return uVar6;
      }
      uVar7 = uVar7 >> 1;
      piVar2 = p->pGia->pRefs;
      iVar4 = piVar2[uVar7];
      piVar2[uVar7] = iVar4 + 1;
      if (iVar4 == 0) {
        if ((p->vCuts).nSize <= (int)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = (p->vCuts).pArray[uVar7];
        pwVar3 = (p->pMem).pPages[(int)uVar1 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar5 = (long)(int)(uVar1 & (p->pMem).uPageMask);
        if ((*(uint *)((long)pwVar3 + lVar5 * 8 + 4) & 0xf) == 1) {
          if ((int)(uint)pwVar3[lVar5 + 1] < 0) goto LAB_006ca613;
          if ((uint)pwVar3[lVar5 + 1] >> 1 == uVar7) goto LAB_006ca5e6;
        }
        iVar4 = Jf_CutAreaRef_rec(p,(int *)((long)pwVar3 + lVar5 * 8 + 4));
        uVar6 = uVar6 + iVar4;
      }
LAB_006ca5e6:
      Vec_IntPush(p->vTemp,uVar7);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (*pCut & 0xf));
  }
  return uVar6;
}

Assistant:

int Jf_CutAreaRef_rec( Jf_Man_t * p, int * pCut )
{
    int i, Var, Count = Jf_CutCost(pCut);
    Jf_CutForEachVar( pCut, Var, i )
    {
        if ( !Gia_ObjRefIncId(p->pGia, Var) && !Jf_CutIsTriv(Jf_ObjCutBest(p, Var), Var) )
            Count += Jf_CutAreaRef_rec( p, Jf_ObjCutBest(p, Var) );
        Vec_IntPush( p->vTemp, Var );
    }
    return Count;
}